

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdSetPsbtTxInUtxo(void *handle,void *psbt_handle,char *txid,uint32_t vout,int64_t amount,
                      char *locking_script,char *full_tx_hex)

{
  undefined **ppuVar1;
  bool *pbVar2;
  Psbt *pPVar3;
  bool bVar4;
  CfdException *pCVar5;
  TxOut txout;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  OutPoint outpoint;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> pubkeys;
  Script redeem_script;
  Script script;
  undefined1 local_198 [16];
  char *local_188;
  Script local_180;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_148;
  OutPoint local_130;
  TxOutReference local_108;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_b8;
  Script local_a0;
  Script local_68;
  
  cfd::Initialize();
  ppuVar1 = (undefined **)(local_198 + 0x10);
  local_198._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_198);
  if ((undefined **)local_198._0_8_ != ppuVar1) {
    operator_delete((void *)local_198._0_8_);
  }
  bVar4 = cfd::capi::IsEmptyString(txid);
  if (bVar4) {
    local_198._0_8_ = "cfdcapi_psbt.cpp";
    local_198._8_4_ = 0x323;
    local_188 = "CfdSetPsbtTxInUtxo";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_198,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_198._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_198);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) == 0) {
    local_198._0_8_ = "cfdcapi_psbt.cpp";
    local_198._8_4_ = 0x329;
    local_188 = "CfdSetPsbtTxInUtxo";
    cfd::core::logger::log<>((CfdSourceLocation *)local_198,kCfdLogLevelWarning,"psbt is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_198._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)local_198);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_108,txid,(allocator *)&local_a0);
  cfd::core::Txid::Txid((Txid *)local_198,(string *)&local_108);
  cfd::core::OutPoint::OutPoint(&local_130,(Txid *)local_198,vout);
  local_198._0_8_ = &PTR__Txid_00723450;
  if ((void *)CONCAT44(local_198._12_4_,local_198._8_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_198._12_4_,local_198._8_4_));
  }
  pbVar2 = &local_108.super_AbstractTxOutReference.value_.ignore_check_;
  if (local_108.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar2) {
    operator_delete(local_108.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
  }
  cfd::Psbt::GetTxInRedeemScript
            (&local_a0,*(Psbt **)((long)psbt_handle + 0x18),&local_130,true,(bool *)0x0);
  local_148.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = cfd::capi::IsEmptyString(full_tx_hex);
  if (!bVar4) {
    std::__cxx11::string::string((string *)&local_108,full_tx_hex,(allocator *)&local_68);
    cfd::core::Transaction::Transaction((Transaction *)local_198,(string *)&local_108);
    if (local_108.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar2)
    {
      operator_delete(local_108.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
    }
    cfd::Psbt::SetTxInUtxo
              (*(Psbt **)((long)psbt_handle + 0x18),&local_130,(Transaction *)local_198,&local_a0,
               &local_148);
    cfd::core::Transaction::~Transaction((Transaction *)local_198);
    goto LAB_00412e13;
  }
  bVar4 = cfd::capi::IsEmptyString(locking_script);
  if (bVar4) goto LAB_00412e13;
  std::__cxx11::string::string((string *)local_198,locking_script,(allocator *)&local_108);
  cfd::core::Script::Script(&local_68,(string *)local_198);
  if ((undefined **)local_198._0_8_ != ppuVar1) {
    operator_delete((void *)local_198._0_8_);
  }
  cfd::core::Amount::Amount((Amount *)&local_108,amount);
  cfd::core::TxOut::TxOut((TxOut *)local_198,(Amount *)&local_108,&local_68);
  cfd::Psbt::GetTxInKeyDataList(&local_b8,*(Psbt **)((long)psbt_handle + 0x18),&local_130);
  bVar4 = cfd::core::Script::IsWitnessProgram(&local_68);
  if (bVar4) {
LAB_00412d28:
    pPVar3 = *(Psbt **)((long)psbt_handle + 0x18);
    cfd::core::TxOutReference::TxOutReference(&local_108,(TxOut *)local_198);
    cfd::Psbt::SetTxInUtxo(pPVar3,&local_130,&local_108,&local_a0,&local_148);
  }
  else {
    bVar4 = cfd::core::Script::IsEmpty(&local_a0);
    if ((!bVar4) ||
       (local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
        .super__Vector_impl_data._M_start !=
        local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
        .super__Vector_impl_data._M_finish)) goto LAB_00412d28;
    pPVar3 = *(Psbt **)((long)psbt_handle + 0x18);
    cfd::core::TxOutReference::TxOutReference(&local_108,(TxOut *)local_198);
    cfd::Psbt::SetTxInWitnessUtxoDirect(pPVar3,&local_130,&local_108);
  }
  local_108.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__AbstractTxOutReference_00723740;
  cfd::core::Script::~Script(&local_108.super_AbstractTxOutReference.locking_script_);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_b8);
  local_198._0_8_ = &PTR__AbstractTxOut_0072e7f0;
  cfd::core::Script::~Script(&local_180);
  cfd::core::Script::~Script(&local_68);
LAB_00412e13:
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_148);
  cfd::core::Script::~Script(&local_a0);
  local_130.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  if (local_130.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdSetPsbtTxInUtxo(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout,
    int64_t amount, const char* locking_script, const char* full_tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    OutPoint outpoint(Txid(txid), vout);
    auto redeem_script = psbt_obj->psbt->GetTxInRedeemScript(outpoint, true);
    std::vector<KeyData> key_list;
    if (!IsEmptyString(full_tx_hex)) {
      Transaction tx(full_tx_hex);
      psbt_obj->psbt->SetTxInUtxo(outpoint, tx, redeem_script, key_list);
    } else if (!IsEmptyString(locking_script)) {
      Script script(locking_script);
      TxOut txout(Amount(amount), script);
      auto pubkeys = psbt_obj->psbt->GetTxInKeyDataList(outpoint);
      if (script.IsWitnessProgram() || (!redeem_script.IsEmpty()) ||
          (!pubkeys.empty())) {
        psbt_obj->psbt->SetTxInUtxo(
            outpoint, TxOutReference(txout), redeem_script, key_list);
      } else {  // on P2SH-segwit
        psbt_obj->psbt->SetTxInWitnessUtxoDirect(
            outpoint, TxOutReference(txout));
      }
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}